

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O1

PDFObject * __thiscall PDFObjectParser::ParseNewObject(PDFObjectParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  EPDFObjectType EVar5;
  PDFDictionary *this_00;
  longlong lVar6;
  PDFInteger *this_01;
  undefined4 extraout_var;
  LongFilePositionType LVar7;
  PDFDictionary *pPVar8;
  ObjectIDType inObjectID;
  unsigned_long inVersion;
  _Alloc_hider this_02;
  PDFObjectParser *this_03;
  string token;
  string keywordToken;
  string numberToken;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  this_02._M_p = (pointer)this;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  bVar3 = GetNextToken(this,&local_90);
  if (!bVar3) goto LAB_001d3ef5;
  bVar3 = IsBoolean((PDFObjectParser *)this_02._M_p,&local_90);
  sVar2 = local_90._M_string_length;
  if (bVar3) {
    this_00 = (PDFDictionary *)ParseBoolean((PDFObjectParser *)this_02._M_p,&local_90);
    goto LAB_001d3ef7;
  }
  if (local_90._M_string_length != 0) {
    if (*local_90._M_dataplus._M_p == '(') {
      this_00 = (PDFDictionary *)ParseLiteralString(this,&local_90);
      goto LAB_001d3ef7;
    }
    if (((local_90._M_string_length != 0) && (*local_90._M_dataplus._M_p == '<')) &&
       ((local_90._M_string_length == 1 || (local_90._M_dataplus._M_p[1] != '<')))) {
      this_00 = (PDFDictionary *)ParseHexadecimalString(this,&local_90);
      goto LAB_001d3ef7;
    }
  }
  if ((scNull_abi_cxx11_._M_string_length == local_90._M_string_length) &&
     ((scNull_abi_cxx11_._M_string_length == 0 ||
      (this_02 = scNull_abi_cxx11_._M_dataplus,
      iVar4 = bcmp(scNull_abi_cxx11_._M_dataplus._M_p,local_90._M_dataplus._M_p,
                   scNull_abi_cxx11_._M_string_length), iVar4 == 0)))) {
    this_00 = (PDFDictionary *)operator_new(0x48);
    PDFNull::PDFNull((PDFNull *)this_00);
    goto LAB_001d3ef7;
  }
  if ((sVar2 != 0) && (*local_90._M_dataplus._M_p == '/')) {
    this_00 = (PDFDictionary *)ParseName(this,&local_90);
    goto LAB_001d3ef7;
  }
  bVar3 = IsNumber((PDFObjectParser *)this_02._M_p,&local_90);
  if (bVar3) {
    this_00 = (PDFDictionary *)ParseNumber((PDFObjectParser *)this_02._M_p,&local_90);
    if (this_00 != (PDFDictionary *)0x0) {
      EVar5 = PDFObject::GetType((PDFObject *)this_00);
      if ((EVar5 != ePDFObjectInteger) ||
         (lVar6 = PDFInteger::GetValue((PDFInteger *)this_00), lVar6 < 1)) goto LAB_001d3ef7;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      this_03 = this;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      bVar3 = GetNextToken(this,&local_50);
      if (bVar3) {
        bVar3 = IsNumber(this_03,&local_50);
        if (bVar3) {
          this_01 = (PDFInteger *)ParseNumber(this_03,&local_50);
          if (((this_01 == (PDFInteger *)0x0) ||
              (EVar5 = PDFObject::GetType((PDFObject *)this_01), EVar5 != ePDFObjectInteger)) ||
             (lVar6 = PDFInteger::GetValue(this_01), lVar6 < 0)) {
            SaveTokenToBuffer(this,&local_50);
          }
          else {
            paVar1 = &local_70.field_2;
            local_70._M_string_length = 0;
            local_70.field_2._M_local_buf[0] = '\0';
            local_70._M_dataplus._M_p = (pointer)paVar1;
            bVar3 = GetNextToken(this,&local_70);
            if (bVar3) {
              if ((local_70._M_string_length == scR_abi_cxx11_._M_string_length) &&
                 ((local_70._M_string_length == 0 ||
                  (iVar4 = bcmp(local_70._M_dataplus._M_p,scR_abi_cxx11_._M_dataplus._M_p,
                                local_70._M_string_length), iVar4 == 0)))) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != paVar1) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                           local_70.field_2._M_local_buf[0]) + 1);
                }
                pPVar8 = (PDFDictionary *)operator_new(0x58);
                inObjectID = PDFInteger::GetValue((PDFInteger *)this_00);
                inVersion = PDFInteger::GetValue(this_01);
                PDFIndirectObjectReference::PDFIndirectObjectReference
                          ((PDFIndirectObjectReference *)pPVar8,inObjectID,inVersion);
                (*(this_00->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1])(this_00);
                this_00 = pPVar8;
                goto LAB_001d3f3c;
              }
              SaveTokenToBuffer(this,&local_50);
              SaveTokenToBuffer(this,&local_70);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != paVar1) {
              operator_delete(local_70._M_dataplus._M_p,
                              CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                       local_70.field_2._M_local_buf[0]) + 1);
            }
          }
LAB_001d3f3c:
          if (this_01 != (PDFInteger *)0x0) {
            (*(this_01->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1])(this_01);
          }
        }
        else {
          SaveTokenToBuffer(this,&local_50);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_001d3ef7;
    }
  }
  else {
    if ((scLeftSquare_abi_cxx11_._M_string_length == sVar2) &&
       ((scLeftSquare_abi_cxx11_._M_string_length == 0 ||
        (iVar4 = bcmp(scLeftSquare_abi_cxx11_._M_dataplus._M_p,local_90._M_dataplus._M_p,
                      scLeftSquare_abi_cxx11_._M_string_length), iVar4 == 0)))) {
      this_00 = (PDFDictionary *)ParseArray(this);
      goto LAB_001d3ef7;
    }
    if ((scDoubleLeftAngle_abi_cxx11_._M_string_length != sVar2) ||
       ((scDoubleLeftAngle_abi_cxx11_._M_string_length != 0 &&
        (iVar4 = bcmp(scDoubleLeftAngle_abi_cxx11_._M_dataplus._M_p,local_90._M_dataplus._M_p,
                      scDoubleLeftAngle_abi_cxx11_._M_string_length), iVar4 != 0)))) {
      this_00 = (PDFDictionary *)operator_new(0x68);
      PDFSymbol::PDFSymbol((PDFSymbol *)this_00,&local_90);
      goto LAB_001d3ef7;
    }
    pPVar8 = (PDFDictionary *)ParseDictionary(this);
    if (pPVar8 != (PDFDictionary *)0x0) {
      bVar3 = GetNextToken(this,&local_90);
      this_00 = pPVar8;
      if (bVar3) {
        if ((scStream_abi_cxx11_._M_string_length == local_90._M_string_length) &&
           ((scStream_abi_cxx11_._M_string_length == 0 ||
            (iVar4 = bcmp(scStream_abi_cxx11_._M_dataplus._M_p,local_90._M_dataplus._M_p,
                          scStream_abi_cxx11_._M_string_length), iVar4 == 0)))) {
          this_00 = (PDFDictionary *)operator_new(0x58);
          iVar4 = (*this->mCurrentPositionProvider->_vptr_IReadPositionProvider[2])();
          LVar7 = PDFParserTokenizer::GetReadBufferSize(&this->mTokenizer);
          PDFStreamInput::PDFStreamInput
                    ((PDFStreamInput *)this_00,pPVar8,CONCAT44(extraout_var,iVar4) - LVar7);
        }
        else {
          SaveTokenToBuffer(this,&local_90);
        }
      }
      goto LAB_001d3ef7;
    }
  }
LAB_001d3ef5:
  this_00 = (PDFDictionary *)0x0;
LAB_001d3ef7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return &this_00->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseNewObject()
{
	PDFObject* pdfObject = NULL;
	std::string token;

	do
	{
		if(!GetNextToken(token))
			break;

		// based on the parsed token, and perhaps some more, determine the type of object
		// and how to parse it.

		// Boolean
		if(IsBoolean(token))
		{
			pdfObject = ParseBoolean(token);
			break;
		} 
		// Literal String
		else if(IsLiteralString(token))
		{
			pdfObject = ParseLiteralString(token);
			break;
		}
		// Hexadecimal String
		else if(IsHexadecimalString(token))
		{
			pdfObject = ParseHexadecimalString(token);
			break;
		}
		// NULL
		else if (IsNull(token))
		{
			pdfObject = new PDFNull();
			break;
		}
		// Name
		else if(IsName(token))
		{
			pdfObject = ParseName(token);
			break;
		}
		// Number (and possibly an indirect reference)
		else if(IsNumber(token))
		{	
			pdfObject = ParseNumber(token);
			
			// this could be an indirect reference in case this is a positive integer
			// and the next one is also, and then there's an "R" keyword
			if(pdfObject && 
				(pdfObject->GetType() == PDFObject::ePDFObjectInteger) && 
				((PDFInteger*)pdfObject)->GetValue() > 0)
			{
				// try parse version
				std::string numberToken;
				if(!GetNextToken(numberToken)) // k. no next token...cant be reference
					break;

				if(!IsNumber(numberToken)) // k. no number, cant be reference
				{
					SaveTokenToBuffer(numberToken);
					break;
				}

				PDFObject* versionObject = ParseNumber(numberToken); 
				bool isReference = false;
				do
				{
					if(!versionObject || 
                       (versionObject->GetType() != PDFObject::ePDFObjectInteger) ||
						((PDFInteger*)versionObject)->GetValue() < 0) // k. failure to parse number, or no non-negative, cant be reference
					{
						SaveTokenToBuffer(numberToken);
						break;
					}

					// try parse R keyword
					std::string keywordToken;
					if(!GetNextToken(keywordToken)) // k. no next token...cant be reference
						break;

					if(keywordToken != scR) // k. not R...cant be reference
					{
						SaveTokenToBuffer(numberToken);
						SaveTokenToBuffer(keywordToken);
						break;
					}

					isReference = true;
				}while(false);

				// if passed all these, then this is a reference
				if(isReference)
				{
					PDFObject* referenceObject = new PDFIndirectObjectReference(
														(ObjectIDType)((PDFInteger*)pdfObject)->GetValue(),
														(unsigned long)((PDFInteger*)versionObject)->GetValue());
					delete pdfObject;
					pdfObject = referenceObject;
				}
				delete versionObject;
			}
			break;
		}
		// Array
		else if(IsArray(token))
		{
			pdfObject = ParseArray();
			break;
		}
		// Dictionary
		else if (IsDictionary(token))
		{
			pdfObject = ParseDictionary();

			if(pdfObject)
			{
				// could be a stream. will be if the next token is the "stream" keyword
				if(!GetNextToken(token))
					break;

				if(scStream == token) 
				{
					// yes, found a stream. record current position as the position where the stream starts. 
					// remove from the current stream position the size of the tokenizer buffer, which is "read", but not used
					pdfObject = new PDFStreamInput((PDFDictionary*)pdfObject, mCurrentPositionProvider->GetCurrentPosition() - mTokenizer.GetReadBufferSize());
				}
				else
				{
					SaveTokenToBuffer(token);
				}
			}

			break;
		}
		// Symbol (legitimate keyword or error. determine if error based on semantics)
		else
			pdfObject = new PDFSymbol(token);
	}while(false);


	return pdfObject;

}